

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode cpool_shutdown_wait(cpool *cpool,int timeout_ms)

{
  CURLcode CVar1;
  int local_94;
  undefined1 auStack_80 [4];
  CURLcode result;
  curl_pollfds cpfds;
  pollfd a_few_on_stack [10];
  int timeout_ms_local;
  cpool *cpool_local;
  
  Curl_pollfds_init((curl_pollfds *)auStack_80,(pollfd *)&cpfds.field_0x10,10);
  CVar1 = cpool_add_pollfds(cpool,(curl_pollfds *)auStack_80);
  if (CVar1 == CURLE_OK) {
    local_94 = timeout_ms;
    if (999 < timeout_ms) {
      local_94 = 1000;
    }
    Curl_poll(_auStack_80,(uint)cpfds.pfds,(long)local_94);
  }
  Curl_pollfds_cleanup((curl_pollfds *)auStack_80);
  return CVar1;
}

Assistant:

static CURLcode cpool_shutdown_wait(struct cpool *cpool, int timeout_ms)
{
  struct pollfd a_few_on_stack[NUM_POLLS_ON_STACK];
  struct curl_pollfds cpfds;
  CURLcode result;

  Curl_pollfds_init(&cpfds, a_few_on_stack, NUM_POLLS_ON_STACK);

  result = cpool_add_pollfds(cpool, &cpfds);
  if(result)
    goto out;

  Curl_poll(cpfds.pfds, cpfds.n, CURLMIN(timeout_ms, 1000));

out:
  Curl_pollfds_cleanup(&cpfds);
  return result;
}